

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

DIY_MPI_Win diy::mpi::detail::win_allocate(communicator *comm,void **base,uint size,int disp)

{
  MPI_Comm poVar1;
  MPI_Comm *ppoVar2;
  MPI_Win *ppoVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  communicator *in_RDI;
  DIY_MPI_Win win;
  DIY_MPI_Comm local_28 [2];
  undefined8 local_18;
  DIY_MPI_Win local_8;
  
  local_18 = in_RSI;
  local_28[0] = communicator::handle(in_RDI);
  ppoVar2 = mpi_cast(local_28);
  poVar1 = *ppoVar2;
  ppoVar3 = mpi_cast(&local_8);
  MPI_Win_allocate(in_EDX,in_ECX,&ompi_mpi_info_null,poVar1,local_18,ppoVar3);
  return (DIY_MPI_Win)local_8.data;
}

Assistant:

DIY_MPI_Win win_allocate(const communicator& comm, void** base, unsigned size, int disp)
{
#if DIY_HAS_MPI
  DIY_MPI_Win win;
  MPI_Win_allocate(size, disp, MPI_INFO_NULL, mpi_cast(comm.handle()), base, &mpi_cast(win));
  return win;
#else
  (void)comm; (void)disp;
  *base = malloc(size);
  auto mpi_win = MPI_Win(*base, true);
  auto win = make_DIY_MPI_Win(std::move(mpi_win));
  return win;
#endif
}